

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::PeekType(TypeChecker *this,Index depth,Type *out_type)

{
  pointer pTVar1;
  Result RVar2;
  Enum EVar3;
  long lVar4;
  Label *label;
  Label *local_20;
  
  RVar2 = GetLabel(this,0,&local_20);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    pTVar1 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar4 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1;
    if (local_20->type_stack_limit + (ulong)depth < (ulong)(lVar4 >> 3)) {
      *out_type = *(Type *)((long)pTVar1 + ~(ulong)depth * 8 + lVar4);
      EVar3 = Ok;
    }
    else {
      out_type->enum_ = Any;
      out_type->type_index_ = 0;
      EVar3 = local_20->unreachable ^ Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::PeekType(Index depth, Type* out_type) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));

  if (label->type_stack_limit + depth >= type_stack_.size()) {
    *out_type = Type::Any;
    return label->unreachable ? Result::Ok : Result::Error;
  }
  *out_type = type_stack_[type_stack_.size() - depth - 1];
  return Result::Ok;
}